

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QUuid *id)

{
  long lVar1;
  QByteArrayView bytes_00;
  unsigned_short uVar2;
  ByteOrder BVar3;
  uint uVar4;
  qint64 qVar5;
  pointer pvVar6;
  uint *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QUuid QVar7;
  int i;
  uchar *data;
  array<char,_16UL> bytes;
  qint64 in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  QDataStream *this;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar8;
  storage_type *in_stack_ffffffffffffffa8;
  undefined8 local_28;
  uchar local_20 [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  std::array<char,_16UL>::data((array<char,_16UL> *)0x46222c);
  qVar5 = QDataStream::readRawData(this,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (qVar5 == 0x10) {
    BVar3 = QDataStream::byteOrder(in_RDI);
    if (BVar3 == BigEndian) {
      QByteArrayView::QByteArrayView<std::array<char,_16UL>,_true>
                ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (array<char,_16UL> *)this);
      bytes_00.m_size._4_4_ = in_stack_ffffffffffffffa4;
      bytes_00.m_size._0_4_ = in_stack_ffffffffffffffa0;
      bytes_00.m_data = in_stack_ffffffffffffffa8;
      QVar7 = QUuid::fromRfc4122(bytes_00);
      local_28 = QVar7._0_8_;
      *(undefined8 *)in_RSI = local_28;
      local_20 = QVar7.data4;
      *(uchar (*) [8])(in_RSI + 2) = local_20;
    }
    else {
      pvVar6 = std::array<char,_16UL>::data((array<char,_16UL> *)0x4622be);
      uVar4 = qFromLittleEndian<unsigned_int>(in_stack_ffffffffffffff90);
      *in_RSI = uVar4;
      pvVar6 = pvVar6 + 4;
      uVar2 = qFromLittleEndian<unsigned_short>(in_stack_ffffffffffffff90);
      *(unsigned_short *)(in_RSI + 1) = uVar2;
      pvVar6 = pvVar6 + 2;
      uVar2 = qFromLittleEndian<unsigned_short>(in_stack_ffffffffffffff90);
      *(unsigned_short *)((long)in_RSI + 6) = uVar2;
      pvVar6 = pvVar6 + 2;
      for (iVar8 = 0; iVar8 < 8; iVar8 = iVar8 + 1) {
        *(value_type *)((long)in_RSI + (long)iVar8 + 8) = *pvVar6;
        pvVar6 = pvVar6 + 1;
      }
    }
  }
  else {
    QDataStream::setStatus(in_RDI,ReadPastEnd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator>>(QDataStream &s, QUuid &id)
{
    std::array<char, 16> bytes;
    if (s.readRawData(bytes.data(), 16) != 16) {
        s.setStatus(QDataStream::ReadPastEnd);
        return s;
    }

    if (s.byteOrder() == QDataStream::BigEndian) {
        id = QUuid::fromRfc4122(bytes);
    } else {
        const uchar *data = reinterpret_cast<const uchar *>(bytes.data());

        id.data1 = qFromLittleEndian<quint32>(data);
        data += sizeof(quint32);
        id.data2 = qFromLittleEndian<quint16>(data);
        data += sizeof(quint16);
        id.data3 = qFromLittleEndian<quint16>(data);
        data += sizeof(quint16);

        for (int i = 0; i < 8; ++i) {
            id.data4[i] = *(data);
            data++;
        }
    }

    return s;
}